

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QFlags<QtMocConstants::EnumFlags> __thiscall
QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
          (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this,QByteArray *key,
          QFlags<QtMocConstants::EnumFlags> *defaultValue)

{
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (QFlags<QtMocConstants::EnumFlags> *)&cVar2._M_node[1]._M_right;
    }
  }
  return (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
         (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)*(Int *)defaultValue;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }